

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O3

void nivalis::anon_unknown_1::buf_add_polyline
               (vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>
                *draw_buf,View *render_view,
               vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *points,
               color *c,size_t rel_func,float thickness,bool closed,bool line,bool filled)

{
  color *this;
  color *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar9;
  color ret;
  DrawBufferObject obj_fill;
  undefined1 local_178 [80];
  color *local_128;
  _Alloc_hider local_120;
  size_type local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  anon_enum_32 local_100;
  undefined1 local_f8 [48];
  DrawBufferObject local_c8;
  undefined1 local_48 [16];
  
  this_00 = &local_c8.c;
  local_c8.points.
  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.points.
  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.points.
  super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  color::color::color(this_00);
  local_c8.str._M_dataplus._M_p = (pointer)&local_c8.str.field_2;
  local_c8.str._M_string_length = 0;
  local_c8.str.field_2._M_local_buf[0] = '\0';
  local_c8.thickness = 2.0;
  local_c8.rel_func = (size_t)c;
  if (line) {
    std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator=
              (&local_c8.points,
               (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
               render_view);
    local_c8.type = FILLED_POLYGON;
    color::color::color((color *)local_178,(color *)points);
    *(float *)local_178._40_8_ = 0.25;
    color::color::operator=((color *)local_f8,this_00,(color *)local_178);
    std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
    emplace_back<nivalis::DrawBufferObject>(draw_buf,&local_c8);
  }
  if (closed) {
    this = (color *)(local_178 + 0x20);
    local_178._0_8_ = (pointer)0x0;
    local_178._8_8_ = (array<double,_2UL> *)0x0;
    local_178._16_8_ = (array<double,_2UL> *)0x0;
    color::color::color(this);
    local_120._M_p = (pointer)&local_110;
    local_118 = 0;
    local_110._M_local_buf[0] = '\0';
    std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::operator=
              ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
               local_178,&local_c8.points);
    local_178._24_4_ = local_c8.thickness;
    color::color::operator=((color *)local_f8,this,this_00);
    local_128 = (color *)local_c8.rel_func;
    std::__cxx11::string::_M_assign((string *)&local_120);
    local_100 = local_c8.type;
    color::color::operator=((color *)local_f8,this,(color *)points);
    local_100 = (anon_enum_32)rel_func & 0xff;
    std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::reserve
              ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
               local_178,(long)render_view->xmax - *(long *)render_view >> 4);
    dVar4 = *(double *)render_view;
    if (render_view->xmax != dVar4) {
      lVar8 = 8;
      uVar6 = 0;
      do {
        lVar5 = local_178._8_8_ - local_178._0_8_;
        local_f8._0_8_ = *(double *)((long)dVar4 + -8 + lVar8);
        local_f8._8_8_ = *(double *)((long)dVar4 + lVar8);
        if (local_178._8_8_ == local_178._16_8_) {
          std::vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>>::
          _M_realloc_insert<std::array<double,2ul>>
                    ((vector<std::array<double,2ul>,std::allocator<std::array<double,2ul>>> *)
                     local_178,(iterator)local_178._8_8_,(array<double,_2UL> *)local_f8);
        }
        else {
          *(double *)local_178._8_8_ = (double)local_f8._0_8_;
          ((double *)local_178._8_8_)[1] = (double)local_f8._8_8_;
          local_178._8_8_ = local_178._8_8_ + 0x10;
        }
        if (1 < (ulong)(lVar5 >> 4)) {
          lVar7 = (lVar5 >> 4) - 1;
          dVar4 = ((pointer)(local_178._0_8_ + lVar7 * 0x10))->_M_elems[0];
          dVar9 = ((pointer)(local_178._0_8_ + lVar7 * 0x10))->_M_elems[1];
          dVar1 = *(double *)(local_178._0_8_ + lVar5 + -0x20);
          dVar2 = *(double *)(local_178._0_8_ + lVar5 + -0x18);
          dVar3 = atan2(*(double *)(local_178._0_8_ + lVar5 + 8) - dVar9,
                        *(double *)(local_178._0_8_ + lVar5) - dVar4);
          dVar3 = fmod(dVar3 + 6.283185307179586,6.283185307179586);
          local_48._8_4_ = extraout_XMM0_Dc;
          local_48._0_8_ = dVar3;
          local_48._12_4_ = extraout_XMM0_Dd;
          dVar4 = atan2(dVar9 - dVar2,dVar4 - dVar1);
          dVar4 = fmod(dVar4 + 6.283185307179586,6.283185307179586);
          dVar9 = ABS(((double)local_48._0_8_ + 6.283185307179586) - dVar4);
          if (ABS((double)local_48._0_8_ - dVar4) <= dVar9) {
            dVar9 = ABS((double)local_48._0_8_ - dVar4);
          }
          if (ABS(dVar9 + -3.141592653589793) < 0.1) {
            std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::
            push_back(draw_buf,(value_type *)local_178);
            dVar4 = ((pointer)(local_178._0_8_ + lVar7 * 0x10))->_M_elems[1];
            *(double *)local_178._0_8_ = ((pointer)(local_178._0_8_ + lVar7 * 0x10))->_M_elems[0];
            ((double *)local_178._0_8_)[1] = dVar4;
            dVar4 = ((double *)(local_178._0_8_ + lVar5))[1];
            ((pointer)(local_178._0_8_ + 0x10))->_M_elems[0] = *(double *)(local_178._0_8_ + lVar5);
            ((pointer)(local_178._0_8_ + 0x10))->_M_elems[1] = dVar4;
            std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::resize
                      ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *
                       )local_178,2);
          }
        }
        uVar6 = uVar6 + 1;
        dVar4 = *(double *)render_view;
        lVar8 = lVar8 + 0x10;
      } while (uVar6 < (ulong)((long)render_view->xmax - (long)dVar4 >> 4));
    }
    std::vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_>::push_back
              (draw_buf,(value_type *)local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_p != &local_110) {
      operator_delete(local_120._M_p,
                      CONCAT71(local_110._M_allocated_capacity._1_7_,local_110._M_local_buf[0]) + 1)
      ;
    }
    if ((pointer)local_178._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_178._0_8_,local_178._16_8_ - local_178._0_8_);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.str._M_dataplus._M_p != &local_c8.str.field_2) {
    operator_delete(local_c8.str._M_dataplus._M_p,
                    CONCAT71(local_c8.str.field_2._M_allocated_capacity._1_7_,
                             local_c8.str.field_2._M_local_buf[0]) + 1);
  }
  if (local_c8.points.
      super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.points.
                    super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_c8.points.
                          super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.points.
                          super__Vector_base<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void buf_add_polyline(
        std::vector<DrawBufferObject>& draw_buf,
        const Plotter::View& render_view,
        const std::vector<std::array<double, 2> >& points,
        const color::color& c, size_t rel_func, float thickness = 1.,
        bool closed = false, bool line = true, bool filled = false) {
    DrawBufferObject obj_fill;
    obj_fill.rel_func = rel_func;
    obj_fill.thickness = thickness;
    if (filled) {
        obj_fill.points = points;
        obj_fill.type = DrawBufferObject::FILLED_POLYGON;
        obj_fill.c = get_ineq_color(c);
        draw_buf.push_back(std::move(obj_fill));
    }
    if (line) {
        // Detect colinearities
        DrawBufferObject obj;
        obj = obj_fill;
        obj.c = c;
        obj.type = closed ? DrawBufferObject::POLYGON :
            DrawBufferObject::POLYLINE;
        obj.points.reserve(points.size());
        // draw_buf.push_back(std::move(obj_tmp));
        for (size_t i = 0; i < points.size(); ++i) {
            // if (std::isnan(points[i][0])) break;
            size_t j = obj.points.size();
            obj.points.push_back({points[i][0], points[i][1]});
            if (j >= 2) {
                double ax = (obj.points[j][0] - obj.points[j-1][0]);
                double ay = (obj.points[j][1] - obj.points[j-1][1]);
                double bx = (obj.points[j-1][0] - obj.points[j-2][0]);
                double by = (obj.points[j-1][1] - obj.points[j-2][1]);
                double theta_a = std::fmod(std::atan2(ay, ax) + 2*M_PI, 2*M_PI);
                double theta_b = std::fmod(std::atan2(by, bx) + 2*M_PI, 2*M_PI);
                double angle_between = std::min(std::fabs(theta_a - theta_b),
                        std::fabs(theta_a + 2*M_PI - theta_b));
                if (std::fabs(angle_between - M_PI) < 1e-1) {
                    // Near-colinear, currently ImGui's polyline drawing may will break
                    // in this case. We split the obj.points here.
                    draw_buf.push_back(obj);
                    obj.points[0] = obj.points[j-1]; obj.points[1] = obj.points[j];
                    obj.points.resize(2);
                }
            }
        }
        draw_buf.push_back(obj);
    }
}